

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void ParseEntity(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  Lexer *pLVar2;
  bool bVar3;
  uint uVar4;
  tchar c1;
  byte bVar5;
  uint c;
  int iVar6;
  int iVar7;
  Bool BVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  char *pcVar15;
  ulong uVar16;
  Lexer *lexer;
  uint uVar17;
  ulong uVar18;
  TidyDocImpl *pTVar19;
  char cVar20;
  uint ch;
  uint entver;
  uint local_8c;
  Bool local_88;
  tchar local_84;
  ulong local_80;
  TidyDocImpl *local_78;
  uint local_70;
  uint local_6c;
  Lexer *local_68;
  int local_60;
  tchar local_5c;
  uint local_58;
  GetTokenMode local_54;
  undefined4 local_50;
  undefined4 local_4c;
  ulong local_48;
  Lexer *local_40;
  ulong local_38;
  
  local_80 = (ulong)*(uint *)((doc->config).value + 0x40);
  local_88 = *(Bool *)((doc->config).value + 0x67);
  local_6c = 0;
  local_68 = doc->lexer;
  local_38 = (ulong)local_68->lexsize;
  local_70 = local_68->lexsize - 1;
  local_58 = doc->docIn->curcol - 1;
  uVar18 = 0;
  local_78 = doc;
  local_54 = mode;
  do {
    uVar16 = uVar18;
LAB_00146c72:
    c = prvTidyReadChar(local_78->docIn);
    pTVar19 = local_78;
    if (c == 0xffffffff) {
      uVar14 = 1;
LAB_00146d51:
      lexer = local_68;
      uVar17 = local_70;
      local_68->lexbuf[local_68->lexsize] = '\0';
      uVar18 = (ulong)local_70;
      iVar7 = prvTidytmbstrcmp(local_68->lexbuf + uVar18,"&apos");
      if ((((iVar7 == 0) && (*(int *)((pTVar19->config).value + 100) == 0)) &&
          (lexer->isvoyager == no)) &&
         ((*(int *)((pTVar19->config).value + 0x62) == 0 &&
          (iVar7 = prvTidyHTMLVersion(pTVar19), iVar7 != 0x20000)))) {
        prvTidyReportEntityError(pTVar19,0x225,lexer->lexbuf + uVar18,0x27);
      }
      if (c == 0x3b && local_54 == OtherNamespace) {
        local_8c = 0xff;
        local_6c = 0x60000;
        cVar20 = true;
        local_4c = 0;
      }
      else {
        BVar8 = prvTidyEntityInfo(lexer->lexbuf + uVar18,local_88,&local_8c,&local_6c);
        cVar20 = BVar8 != no;
        local_4c = CONCAT31((int3)(BVar8 >> 8),local_80 == 0);
      }
      if (((char)local_4c == '\0') || ((bool)cVar20 == false)) goto LAB_001471a3;
      local_80 = CONCAT71(local_80._1_7_,cVar20);
      BVar8 = prvTidyIsLowSurrogate(local_8c);
      if (BVar8 == no) {
        BVar8 = prvTidyIsHighSurrogate(local_8c);
        cVar20 = (char)local_80;
        if (BVar8 != no) {
          prvTidyReportSurrogateError(pTVar19,0x22e,local_8c,0);
          local_8c = 0xfffd;
          cVar20 = (char)local_80;
        }
        goto LAB_001471a3;
      }
      uVar9 = prvTidyReadChar(pTVar19->docIn);
      if (uVar9 != 0x26) {
        prvTidyUngetChar(uVar9,pTVar19->docIn);
        prvTidyReportSurrogateError(pTVar19,0x230,local_8c,0);
        local_8c = 0xfffd;
        goto LAB_0014719f;
      }
      local_5c = local_8c;
      pLVar2 = pTVar19->lexer;
      local_84 = 0;
      BVar8 = 2;
      local_50 = uVar14;
      if ((pLVar2 == (Lexer *)0x0) ||
         (local_40 = pLVar2,
         pvVar11 = (*pLVar2->allocator->vtbl->realloc)(pLVar2->allocator,(void *)0x0,0x20),
         pvVar11 == (void *)0x0)) goto LAB_0014716e;
      uVar17 = 0x20;
      uVar10 = 0;
      iVar7 = 0;
      local_48 = uVar18;
      break;
    }
    if (c == 0x3b) {
      uVar14 = 0;
      goto LAB_00146d51;
    }
    iVar7 = (int)uVar16;
    if (c != 0x23 || iVar7 != 0) {
      if (iVar7 == 1 && (int)uVar18 == 1) {
        uVar16 = 2;
        if ((c == 0x78) || (c == 0x58 && local_88 == no)) goto LAB_00146d1a;
      }
      iVar6 = (*(code *)(&PTR_prvTidyIsNamechar_001d2df0)[uVar18])(c);
      pTVar19 = local_78;
      if (iVar6 == 0) {
        prvTidyUngetChar(c,local_78->docIn);
        uVar14 = 1;
        goto LAB_00146d51;
      }
      prvTidyAddCharToLexer(local_68,c);
      uVar16 = (ulong)(iVar7 + 1);
      goto LAB_00146c72;
    }
    if ((*(int *)((local_78->config).value + 0x38) == 0) ||
       (((local_78->config).value[0x22].v & 0xfffffffffffffffe) == 0xc)) {
      prvTidyUngetChar(0x23,local_78->docIn);
      return;
    }
    uVar16 = 1;
    c = 0x23;
LAB_00146d1a:
    prvTidyAddCharToLexer(local_68,c);
    uVar18 = uVar16;
  } while( true );
LAB_00146eb6:
  local_60 = iVar7;
  uVar4 = uVar10;
  uVar18 = (ulong)uVar4;
  uVar9 = prvTidyReadChar(pTVar19->docIn);
  if ((uVar9 == 0xffffffff) || (uVar9 == 0x3b)) goto LAB_00147039;
  if (uVar17 < uVar4 + 2) {
    uVar17 = uVar17 * 2;
    pvVar11 = (*local_40->allocator->vtbl->realloc)(local_40->allocator,pvVar11,(size_t)uVar17);
    if (pvVar11 == (void *)0x0) {
      pvVar11 = (void *)0x0;
      goto LAB_00147039;
    }
  }
  *(char *)((long)pvVar11 + uVar18) = (char)uVar9;
  if (uVar4 == 0) {
    uVar10 = 1;
    iVar7 = local_60;
    if (uVar9 != 0x23) {
      uVar18 = 1;
      goto LAB_00147039;
    }
    goto LAB_00146eb6;
  }
  uVar10 = uVar4 + 1;
  if (uVar4 == 1) {
    iVar7 = 1;
    if ((uVar9 == 0x78) || (uVar9 == 0x58 && local_88 == no)) goto LAB_00146eb6;
  }
  if (local_60 == 0) {
    if (0x7f < uVar9) goto LAB_00146f9b;
    bVar5 = (byte)lexmap[uVar9] & 1;
    iVar7 = 0;
  }
  else {
    if (0x7f < uVar9) goto LAB_00146f9b;
    iVar7 = 1;
    bVar5 = (byte)lexmap[uVar9] & 0x80;
  }
  if (bVar5 == 0) {
LAB_00146f9b:
    uVar18 = (ulong)(uVar4 + 1);
LAB_00147039:
    local_88 = 2;
    bVar3 = true;
    if (uVar9 == 0x3b) {
      *(undefined1 *)((long)pvVar11 + uVar18) = 0;
      pcVar15 = "%x";
      if (local_60 == 0) {
        pcVar15 = "%d";
      }
      iVar7 = __isoc99_sscanf((long)pvVar11 + (2 - (ulong)(local_60 == 0)),pcVar15,&local_84);
      if ((iVar7 == 1) && (BVar8 = prvTidyIsHighSurrogate(local_84), c1 = local_5c, BVar8 != no)) {
        local_84 = prvTidyCombineSurrogatePair(local_84,local_5c);
        BVar8 = prvTidyIsValidCombinedChar(local_84);
        if (BVar8 == no) {
          local_8c = 0xfffd;
          prvTidyReportSurrogateError(pTVar19,0x22f,c1,local_84);
          local_88 = yes;
          bVar3 = false;
        }
        else {
          local_8c = local_84;
          bVar3 = false;
          local_88 = no;
        }
      }
    }
    if (bVar3) {
      if (uVar9 == 0x3b) {
        prvTidyUngetChar(0x3b,pTVar19->docIn);
      }
      if ((pvVar11 != (void *)0x0) && (uVar17 = (int)uVar18 - 1, -1 < (int)uVar17)) {
        lVar12 = (ulong)uVar17 + 1;
        do {
          prvTidyUngetChar((int)*(char *)((long)pvVar11 + lVar12 + -1),pTVar19->docIn);
          lVar13 = lVar12 + -1;
          bVar3 = 0 < lVar12;
          lVar12 = lVar13;
        } while (lVar13 != 0 && bVar3);
      }
    }
    lexer = local_68;
    uVar18 = local_48;
    uVar17 = local_70;
    BVar8 = local_88;
    if (pvVar11 != (void *)0x0) {
      (*local_40->allocator->vtbl->free)(local_40->allocator,pvVar11);
      lexer = local_68;
      uVar18 = local_48;
      uVar17 = local_70;
      BVar8 = local_88;
    }
LAB_0014716e:
    uVar14 = local_50;
    cVar20 = (char)local_80;
    if (BVar8 == 2) {
      prvTidyReportSurrogateError(pTVar19,0x230,local_5c,0);
      prvTidyUngetChar(0x26,pTVar19->docIn);
LAB_0014719f:
      cVar20 = (char)local_80;
    }
LAB_001471a3:
    if (((cVar20 == '\0') || ((local_8c & 0xffffffe0) == 0x80)) || (c != 0x3b && 0xff < local_8c)) {
      lexer->lines = pTVar19->docIn->curline;
      lexer->columns = local_58;
      if ((uint)local_38 < lexer->lexsize) {
        if ((local_8c & 0xffffffe0) == 0x80) {
          uVar9 = prvTidyDecodeWin1252(local_8c);
          if (c != 0x3b) {
            prvTidyReportEntityError(pTVar19,0x25f,lexer->lexbuf + uVar18,c);
          }
          prvTidyReportEncodingError(pTVar19,0x249,local_8c,(uint)(uVar9 == 0));
          lexer->lexsize = uVar17;
          if (uVar9 == 0) {
            return;
          }
        }
        else {
          prvTidyReportEntityError(pTVar19,0x28d,lexer->lexbuf + uVar18,local_8c);
          if ((char)uVar14 != '\0') {
            return;
          }
          uVar9 = 0x3b;
        }
        prvTidyAddCharToLexer(lexer,uVar9);
      }
      else {
        iVar7 = prvTidyHTMLVersion(pTVar19);
        if (iVar7 != 0x20000) {
          prvTidyReportEntityError(pTVar19,0x282,lexer->lexbuf + uVar18,local_8c);
        }
      }
    }
    else {
      if (c != 0x3b) {
        lexer->lines = pTVar19->docIn->curline;
        lexer->columns = local_58;
        prvTidyReportEntityError(pTVar19,0x260,lexer->lexbuf + uVar18,c);
      }
      if ((char)local_4c == '\0') {
        prvTidyAddCharToLexer(lexer,0x3b);
      }
      else {
        lexer->lexsize = uVar17;
        if ((local_54 == Preformatted) && (local_8c == 0xa0)) {
          local_8c = 0x20;
        }
        prvTidyAddCharToLexer(lexer,local_8c);
        if ((local_8c == 0x26) && (*(int *)((local_78->config).value + 0x45) == 0)) {
          bVar5 = 0x61;
          lVar12 = 0;
          do {
            lVar13 = lVar12 + 1;
            prvTidyAddCharToLexer(lexer,(uint)bVar5);
            bVar5 = anon_var_dwarf_1ac68[lVar12 + 0x2c];
            lVar12 = lVar13;
          } while (lVar13 != 4);
        }
      }
      puVar1 = &local_78->lexer->versions;
      *puVar1 = *puVar1 & (local_6c | 0xe000);
    }
    return;
  }
  goto LAB_00146eb6;
}

Assistant:

static void ParseEntity( TidyDocImpl* doc, GetTokenMode mode )
{
    typedef enum
    {
        ENT_default,
        ENT_numdec,
        ENT_numhex
    } ENTState;
    
    typedef Bool (*ENTfn)(uint);
    const ENTfn entFn[] = {
        TY_(IsNamechar),
        TY_(IsDigit),
        IsDigitHex
    };
    uint start;
    ENTState entState = ENT_default;
    uint charRead = 0;
    Bool semicolon = no, found = no;
    Bool isXml = cfgBool( doc, TidyXmlTags );
    Bool preserveEntities = cfgBool( doc, TidyPreserveEntities );
    uint c, ch, startcol, entver = 0;
    Lexer* lexer = doc->lexer;

    start = lexer->lexsize - 1;  /* to start at "&" */
    startcol = doc->docIn->curcol - 1;

    while ( (c = TY_(ReadChar)(doc->docIn)) != EndOfStream )
    {
        if ( c == ';' )
        {
            semicolon = yes;
            break;
        }
        ++charRead;

        if (charRead == 1 && c == '#')
        {
            if ( !cfgBool(doc, TidyNCR) ||
                 cfg(doc, TidyInCharEncoding) == BIG5 ||
                 cfg(doc, TidyInCharEncoding) == SHIFTJIS )
            {
                TY_(UngetChar)('#', doc->docIn);
                return;
            }

            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numdec;
            continue;
        }
        else if (charRead == 2 && entState == ENT_numdec
                 && (c == 'x' || (!isXml && c == 'X')) )
        {
            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numhex;
            continue;
        }

        if ( entFn[entState](c) )
        {
            TY_(AddCharToLexer)( lexer, c );
            continue;
        }

        /* otherwise put it back */
        TY_(UngetChar)( c, doc->docIn );
        break;
    }

    /* make sure entity is NULL terminated */
    lexer->lexbuf[lexer->lexsize] = '\0';

    /* Should contrain version to XML/XHTML if &apos; 
    ** is encountered.  But this is not possible with
    ** Tidy's content model bit mask.
    */
    if ( TY_(tmbstrcmp)(lexer->lexbuf+start, "&apos") == 0
         && !cfgBool(doc, TidyXmlOut)
         && !lexer->isvoyager
         && !cfgBool(doc, TidyXhtmlOut)
         && !(TY_(HTMLVersion)(doc) == HT50) ) /* Issue #239 - no warning if in HTML5++ mode */
        TY_(ReportEntityError)( doc, APOS_UNDEFINED, lexer->lexbuf+start, 39 );

    if (( mode == OtherNamespace ) && ( c == ';' ))
    {
        /* #130 MathML attr and entity fix! */
        found = yes;
        ch = 255;
        entver = XH50|HT50;
        preserveEntities = yes;
    }
    else
    {
        /* Lookup entity code and version
        */
        found = TY_(EntityInfo)( lexer->lexbuf+start, isXml, &ch, &entver );
    }

    /* Issue #483 - Deal with 'surrogate pairs' */
    /* TODO: Maybe warning/error, like found a leading surrogate
       but no following surrogate! Maybe should avoid outputting
       invalid utf-8 for this entity - maybe substitute?  */
    if (!preserveEntities && found && TY_(IsLowSurrogate)(ch))
    {
        uint c1;
        if ((c1 = TY_(ReadChar)(doc->docIn)) == '&')
        {
            SPStatus status;
            /* Have a following entity, 
               so there is a chance of having a valid surrogate pair */
            c1 = ch;    /* keep first value, in case of error */
            status = GetSurrogatePair(doc, isXml, &ch);
            if (status == SP_error)
            {
                TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, c1, 0); /* SP WARNING: - using substitute character */
                TY_(UngetChar)('&', doc->docIn);  /* otherwise put it back */
            }
        }
        else
        {
            /* put this non-entity lead char back */
            TY_(UngetChar)(c1, doc->docIn);
            /* Have leading surrogate pair, with no tail */
            TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, ch, 0); /* SP WARNING: - using substitute character */
            ch = 0xFFFD;
        }
    } 
    else if (!preserveEntities && found && TY_(IsHighSurrogate)(ch))
    {
        /* Have trailing surrogate pair, with no lead */
        TY_(ReportSurrogateError)(doc, BAD_SURROGATE_LEAD, ch, 0); /* SP WARNING: - using substitute character */
        ch = 0xFFFD;
    }

    /* deal with unrecognized or invalid entities */
    /* #433012 - fix by Randy Waki 17 Feb 01 */
    /* report invalid NCR's - Terry Teague 01 Sep 01 */
    if ( !found || (ch >= 128 && ch <= 159) || (ch >= 256 && c != ';') )
    {
        /* set error position just before offending character */
        SetLexerLocus( doc, lexer );
        lexer->columns = startcol;

        if (lexer->lexsize > start + 1)
        {
            if (ch >= 128 && ch <= 159)
            {
                /* invalid numeric character reference */
                
                uint c1 = 0;
                int replaceMode = DISCARDED_CHAR;
            
                /* Always assume Win1252 in this circumstance. */
                c1 = TY_(DecodeWin1252)( ch );

                if ( c1 )
                    replaceMode = REPLACED_CHAR;
                
                if ( c != ';' )  /* issue warning if not terminated by ';' */
                    TY_(ReportEntityError)( doc, MISSING_SEMICOLON_NCR,
                                            lexer->lexbuf+start, c );
 
                TY_(ReportEncodingError)(doc, INVALID_NCR, ch, replaceMode == DISCARDED_CHAR);
                
                if ( c1 )
                {
                    /* make the replacement */
                    lexer->lexsize = start;
                    TY_(AddCharToLexer)( lexer, c1 );
                    semicolon = no;
                }
                else
                {
                    /* discard */
                    lexer->lexsize = start;
                    semicolon = no;
               }
               
            }
            else
                TY_(ReportEntityError)( doc, UNKNOWN_ENTITY,
                                        lexer->lexbuf+start, ch );

            if (semicolon)
                TY_(AddCharToLexer)( lexer, ';' );
        }
        else
        {
            /*\ 
             *  Issue #207 - A naked & is allowed in HTML5, as an unambiguous ampersand!
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(ReportEntityError)( doc, UNESCAPED_AMPERSAND,
                                    lexer->lexbuf+start, ch );
            }
        }
    }
    else
    {
        if ( c != ';' )    /* issue warning if not terminated by ';' */
        {
            /* set error position just before offending character */
            SetLexerLocus( doc, lexer );
            lexer->columns = startcol;
            TY_(ReportEntityError)( doc, MISSING_SEMICOLON, lexer->lexbuf+start, c );
        }

        if (preserveEntities)
            TY_(AddCharToLexer)( lexer, ';' );
        else
        {
            lexer->lexsize = start;
            if ( ch == 160 && (mode == Preformatted) )
                ch = ' ';
            TY_(AddCharToLexer)( lexer, ch );

            if ( ch == '&' && !cfgBool(doc, TidyQuoteAmpersand) )
                AddStringToLexer( lexer, "amp;" );
        }

        /* Detect extended vs. basic entities */
        TY_(ConstrainVersion)( doc, entver );
    }
}